

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::BoolOption::printOptionCall(BoolOption *this,stringstream *s)

{
  ostream *poVar1;
  long in_RSI;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x10),"-no-");
    std::operator<<(poVar1,*(char **)(in_RDI + 8));
  }
  else {
    poVar1 = std::operator<<((ostream *)(in_RSI + 0x10),"-");
    std::operator<<(poVar1,*(char **)(in_RDI + 8));
  }
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s)
    {
        if (value) {
            s << "-" << name;
        } else {
            s << "-no-" << name;
        }
    }